

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_table.cpp
# Opt level: O2

void __thiscall ArrayTable_NumericKey_Test::TestBody(ArrayTable_NumericKey_Test *this)

{
  long lVar1;
  char *message;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  value;
  initializer_list<sax_event_t> __l;
  allocator_type local_311;
  AssertHelper local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  events_aggregator_t handler;
  vector<sax_event_t,_std::allocator<sax_event_t>_> expected_events;
  AssertionResult gtest_ar;
  sax_event_t local_258;
  undefined4 local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [40];
  istringstream input;
  
  std::__cxx11::string::string((string *)&gtest_ar,"[[123]]",(allocator *)&local_308);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&gtest_ar,_S_in);
  std::__cxx11::string::~string((string *)&gtest_ar);
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)&input,&handler);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::string::string((string *)&local_308,"123",(allocator *)&local_310);
  value._M_len = 1;
  value._M_array = &local_308;
  sax_event_t::sax_event_t(&local_258,table_array_item,value);
  local_200 = 2;
  local_1e8 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e0 = local_1d0;
  local_1d8 = 0;
  local_1d0[0] = 0;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::vector(&expected_events,__l,&local_311);
  lVar1 = 0xb0;
  do {
    sax_event_t::~sax_event_t((sax_event_t *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x58;
  } while (lVar1 != -0x58);
  std::__cxx11::string::~string((string *)&local_308);
  testing::internal::
  CmpHelperEQ<std::vector<sax_event_t,std::allocator<sax_event_t>>,std::vector<sax_event_t,std::allocator<sax_event_t>>>
            ((internal *)&gtest_ar,"expected_events","handler.events",&expected_events,
             &handler.events);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_308);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/array_table.cpp"
               ,0x21,message);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&expected_events);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&handler.events);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  return;
}

Assistant:

TEST(ArrayTable, NumericKey) {
    std::istringstream input("[[123]]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table_array_item, {"123"}},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}